

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O2

void __thiscall
IR::IRBuilder::cjump(IRBuilder *this,Expr *cond,BasicBlock *iftrue,BasicBlock *iffalse)

{
  bool bVar1;
  BasicBlock *local_28;
  BasicBlock *local_20;
  Expr *local_18;
  _Fwd_list_node_base *local_10;
  
  local_28 = iffalse;
  local_20 = iftrue;
  local_18 = cond;
  bVar1 = BasicBlock::isTerminated(this->block_);
  if (!bVar1) {
    std::forward_list<IR::CJump,std::allocator<IR::CJump>>::
    emplace_front<IR::Expr_const*&,IR::BasicBlock*&,IR::BasicBlock*&>
              ((forward_list<IR::CJump,std::allocator<IR::CJump>> *)&this->function_->cjumps_,
               &local_18,&local_20,&local_28);
    local_10 = (this->function_->cjumps_).
               super__Fwd_list_base<IR::CJump,_std::allocator<IR::CJump>_>._M_impl._M_head._M_next +
               1;
    std::vector<IR::Stmt*,std::allocator<IR::Stmt*>>::emplace_back<IR::Stmt*>
              ((vector<IR::Stmt*,std::allocator<IR::Stmt*>> *)this->block_,(Stmt **)&local_10);
  }
  return;
}

Assistant:

void IRBuilder::cjump(const Expr* cond, BasicBlock* iftrue,
                      BasicBlock* iffalse) {
  if (block_->isTerminated()) return;
  function_->cjumps_.emplace_front(cond, iftrue, iffalse);
  block_->push_back(&function_->cjumps_.front());
}